

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audio-logger.cpp
# Opt level: O0

void __thiscall AudioLogger::Data::Data(Data *this)

{
  iterator pvVar1;
  iterator pvVar2;
  array<float,_512UL> *in_RDI;
  value_type *record;
  iterator __end1_1;
  iterator __begin1_1;
  array<std::vector<std::array<float,_512UL>,_std::allocator<std::array<float,_512UL>_>_>,_16UL>
  *__range1_1;
  value_type *frame;
  iterator __end1;
  iterator __begin1;
  array<std::array<float,_512UL>,_939UL> *__range1;
  undefined1 in_stack_ffffffffffffff7f;
  Parameters *this_00;
  value_type_conflict3 *__u;
  iterator local_50;
  iterator local_18;
  
  *(undefined4 *)
   &(((vector<std::array<float,_512UL>,_std::allocator<std::array<float,_512UL>_>_> *)
     in_RDI->_M_elems)->
    super__Vector_base<std::array<float,_512UL>,_std::allocator<std::array<float,_512UL>_>_>).
    _M_impl.super__Vector_impl_data._M_start = 0;
  *(undefined4 *)
   ((long)&(((vector<std::array<float,_512UL>,_std::allocator<std::array<float,_512UL>_>_> *)
            in_RDI->_M_elems)->
           super__Vector_base<std::array<float,_512UL>,_std::allocator<std::array<float,_512UL>_>_>)
           ._M_impl.super__Vector_impl_data._M_start + 4) = 0xffffffff;
  *(undefined4 *)
   &(((vector<std::array<float,_512UL>,_std::allocator<std::array<float,_512UL>_>_> *)
     in_RDI->_M_elems)->
    super__Vector_base<std::array<float,_512UL>,_std::allocator<std::array<float,_512UL>_>_>).
    _M_impl.super__Vector_impl_data._M_finish = 0;
  *(undefined4 *)
   ((long)&(((vector<std::array<float,_512UL>,_std::allocator<std::array<float,_512UL>_>_> *)
            in_RDI[0x3ab]._M_elems)->
           super__Vector_base<std::array<float,_512UL>,_std::allocator<std::array<float,_512UL>_>_>)
           ._M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  this_00 = (Parameters *)
            &((vector<std::array<float,_512UL>,_std::allocator<std::array<float,_512UL>_>_> *)
             in_RDI[0x3ab]._M_elems)[3].
             super__Vector_base<std::array<float,_512UL>,_std::allocator<std::array<float,_512UL>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  std::
  array<std::vector<std::array<float,_512UL>,_std::allocator<std::array<float,_512UL>_>_>,_16UL>::
  array((array<std::vector<std::array<float,_512UL>,_std::allocator<std::array<float,_512UL>_>_>,_16UL>
         *)in_RDI);
  __u = (value_type_conflict3 *)
        ((long)((vector<std::array<float,_512UL>,_std::allocator<std::array<float,_512UL>_>_> *)
                in_RDI[0x3ab]._M_elems + 0x13) + 8);
  Parameters::Parameters(this_00);
  TFilterCoefficients::TFilterCoefficients
            ((TFilterCoefficients *)
             ((vector<std::array<float,_512UL>,_std::allocator<std::array<float,_512UL>_>_> *)
              in_RDI[0x3ab]._M_elems + 0x16));
  std::mutex::mutex((mutex *)0x1c92d3);
  std::atomic<bool>::atomic((atomic<bool> *)this_00,(bool)in_stack_ffffffffffffff7f);
  local_18 = std::array<std::array<float,_512UL>,_939UL>::begin
                       ((array<std::array<float,_512UL>,_939UL> *)0x1c92fe);
  pvVar1 = std::array<std::array<float,_512UL>,_939UL>::end
                     ((array<std::array<float,_512UL>,_939UL> *)0x1c930d);
  for (; local_18 != pvVar1; local_18 = local_18 + 1) {
    std::array<float,_512UL>::fill(in_RDI,__u);
  }
  local_50 = std::
             array<std::vector<std::array<float,_512UL>,_std::allocator<std::array<float,_512UL>_>_>,_16UL>
             ::begin((array<std::vector<std::array<float,_512UL>,_std::allocator<std::array<float,_512UL>_>_>,_16UL>
                      *)0x1c9396);
  pvVar2 = std::
           array<std::vector<std::array<float,_512UL>,_std::allocator<std::array<float,_512UL>_>_>,_16UL>
           ::end((array<std::vector<std::array<float,_512UL>,_std::allocator<std::array<float,_512UL>_>_>,_16UL>
                  *)0x1c93a5);
  for (; local_50 != pvVar2; local_50 = local_50 + 1) {
    std::vector<std::array<float,_512UL>,_std::allocator<std::array<float,_512UL>_>_>::clear
              ((vector<std::array<float,_512UL>,_std::allocator<std::array<float,_512UL>_>_> *)
               0x1c93ca);
  }
  std::array<int,_16UL>::fill((array<int,_16UL> *)in_RDI,(value_type_conflict2 *)__u);
  return;
}

Assistant:

Data() : isReady(false) {
        for (auto & frame : buffer) {
            frame.fill(0);
        }

        for (auto & record : records) {
            record.clear();
        }

        nFramesToRecord.fill(0);
    }